

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O2

QByteArray * __thiscall
QJsonDocument::toJson(QByteArray *__return_storage_ptr__,QJsonDocument *this,JsonFormat format)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> v;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QJsonValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  v._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  if (&(v._M_head_impl)->value == (QCborValue *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QJsonPrivate::Value::fromTrustedCbor(&local_38,&(v._M_head_impl)->value);
    QJsonValue::toJson(__return_storage_ptr__,&local_38,(uint)(format == Compact));
    QJsonValue::~QJsonValue(&local_38);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QJsonDocument::toJson(JsonFormat format) const
{
    QByteArray json;
    if (!d)
        return json;

    return QJsonPrivate::Value::fromTrustedCbor(d->value).toJson(
            format == JsonFormat::Compact ? QJsonValue::JsonFormat::Compact
                                          : QJsonValue::JsonFormat::Indented);
}